

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiAnalyzerSettings.cpp
# Opt level: O2

void __thiscall MidiAnalyzerSettings::MidiAnalyzerSettings(MidiAnalyzerSettings *this)

{
  auto_ptr<AnalyzerSettingInterfaceChannel> *this_00;
  AnalyzerSettingInterfaceChannel *this_01;
  ulong uVar1;
  uint uVar2;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__MidiAnalyzerSettings_00109d70;
  uVar1 = 0xffffffffffffffff;
  Channel::Channel(&this->mInputChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mBitRate = 0x7a12;
  this_00 = &this->mInputChannelInterface;
  (this->mInputChannelInterface)._M_ptr = (AnalyzerSettingInterfaceChannel *)0x0;
  (this->mBitRateInterface)._M_ptr = (AnalyzerSettingInterfaceInteger *)0x0;
  (this->mStopBitsInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mParityInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mDataBitsInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mEndiannessInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  this->mStopBits = 1.0;
  this->mParity = 3.0;
  this->mDataBits = '\b';
  this->mEndianness = true;
  this_01 = (AnalyzerSettingInterfaceChannel *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar1);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_01);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(this_00,this_01);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_00->_M_ptr,"MIDI");
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)this_00->_M_ptr);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar2 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar2,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar2,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar2,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  return;
}

Assistant:

MidiAnalyzerSettings::MidiAnalyzerSettings() : mInputChannel( UNDEFINED_CHANNEL ), mBitRate( 31250 )
{
    mParity = 3;     // default is No parity.
    mStopBits = 1;   // default is 1 stop bit.  1=1, 2=1.5, 3=2.
    mDataBits = 8;   // default
    mEndianness = 1; // TRUE, Big Endian is default.  0=FALSE=LE, 1=TRUE=BE.
    mInputChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mInputChannelInterface->SetTitleAndTooltip( "MIDI", "General MIDI" );
    mInputChannelInterface->SetChannel( mInputChannel );
    /*
        mBitRateInterface.reset( new AnalyzerSettingInterfaceInteger() );
        mBitRateInterface->SetTitleAndTooltip( "Bit Rate (Bits/S)",  "Specify the bit rate in bits per second." );
        mBitRateInterface->SetMax( 31250 );
        mBitRateInterface->SetMin( 31250 ); // Midi only has one speed.  Tolerance is +/- 1%.
        mBitRateInterface->SetInteger( mBitRate );

        mStopBitsInterface.reset( new AnalyzerSettingInterfaceNumberList() );
        mStopBitsInterface->SetTitleAndTooltip( "Stop Bits", "Specify number of stop bits, 1, 1.5, or 2." );
        mStopBitsInterface->AddNumber( 1, "1", "1 stop bit (common)");
        mStopBitsInterface->AddNumber( 1.5, "1.5", "1.5 stop bits (rare)");
        mStopBitsInterface->AddNumber( 2, "2", "2 stop bits (less common, better for noisy lines)");
        mStopBitsInterface->SetNumber( mStopBits );

        mParityInterface.reset( new AnalyzerSettingInterfaceNumberList() );
        mParityInterface->SetTitleAndTooltip( "Parity", "Parity:  Even, Odd, or None." );
        mParityInterface->AddNumber( 1, "Even", "Even Parity");
        mParityInterface->AddNumber( 2, "Odd", "Odd Parity");
        mParityInterface->AddNumber( 3, "None", "No Parity");
        mParityInterface->SetNumber( mParity );

        // FIXME: the below is unfinished!
        mDataBitsInterface.reset( new AnalyzerSettingInterfaceNumberList() );
        mDataBitsInterface->SetTitleAndTooltip( "Data Bits", "" );
        mDataBitsInterface->AddNumber( 1, "Even", "Even Parity");
        mDataBitsInterface->AddNumber( 2, "Odd", "Odd Parity");
        mDataBitsInterface->AddNumber( 3, "None", "No Parity");
        mDataBitsInterface->SetNumber( mParity );

        mEndiannessInterface.reset( new AnalyzerSettingInterfaceNumberList() );
        mEndiannessInterface->SetTitleAndTooltip( "Endianness", "Little or Big Endian" );
        mEndiannessInterface->AddNumber( 0, "Little", "Odd Parity");
        mEndiannessInterface->AddNumber( 1, "Big", "Even Parity");
        mEndiannessInterface->SetNumber( mParity );
    */

    AddInterface( mInputChannelInterface.get() );
    // AddInterface( mBitRateInterface.get() );
    // AddInterface( mStopBitsInterface.get() );
    // AddInterface( mParityInterface.get() );

    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mInputChannel, "MIDI", false );
}